

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O3

Matrix44<float> *
Imath_3_2::addOffset<float>
          (Matrix44<float> *__return_storage_ptr__,Matrix44<float> *inMat,Vec3<float> *tOffset,
          Vec3<float> *rOffset,Vec3<float> *sOffset,Matrix44<float> *ref)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  
  fVar8 = rOffset->x * 0.017453292;
  fVar9 = rOffset->y * 0.017453292;
  fVar4 = rOffset->z * 0.017453292;
  fVar5 = cosf(fVar4);
  fVar6 = cosf(fVar9);
  fVar7 = cosf(fVar8);
  fVar4 = sinf(fVar4);
  fVar9 = sinf(fVar9);
  fVar8 = sinf(fVar8);
  fVar24 = fVar5 * fVar9 * fVar8 - fVar4 * fVar7;
  fVar32 = fVar5 * fVar7 + fVar4 * fVar9 * fVar8;
  fVar12 = fVar4 * fVar8 + fVar7 * fVar5 * fVar9;
  fVar16 = fVar7 * fVar4 * fVar9 - fVar5 * fVar8;
  fVar10 = fVar6 * fVar4 * 0.0;
  fVar28 = -fVar9 * 0.0;
  fVar30 = fVar5 * fVar6 + fVar10 + fVar28;
  fVar25 = fVar5 * fVar6 * 0.0;
  fVar36 = fVar6 * fVar4 + fVar25 + fVar28;
  fVar25 = fVar25 + fVar10;
  fVar28 = fVar28 + fVar25;
  fVar25 = fVar25 - fVar9;
  fVar4 = fVar32 * 0.0;
  fVar5 = fVar6 * fVar8 * 0.0;
  fVar29 = fVar24 + fVar4 + fVar5;
  fVar24 = fVar24 * 0.0;
  fVar33 = fVar32 + fVar24 + fVar5;
  fVar24 = fVar24 + fVar4;
  fVar35 = fVar6 * fVar8 + fVar24;
  fVar24 = fVar24 + fVar5;
  fVar4 = fVar16 * 0.0;
  fVar5 = fVar6 * fVar7 * 0.0;
  fVar32 = fVar12 + fVar4 + fVar5;
  fVar12 = fVar12 * 0.0;
  fVar9 = fVar16 + fVar12 + fVar5;
  fVar12 = fVar12 + fVar4;
  fVar10 = fVar6 * fVar7 + fVar12;
  fVar12 = fVar12 + fVar5;
  fVar4 = sOffset->x;
  fVar8 = fVar4 * 0.0;
  fVar5 = tOffset->x;
  fVar18 = fVar8 * fVar5 + fVar8 * fVar32 + fVar4 * fVar30 + fVar8 * fVar29;
  fVar6 = tOffset->y;
  fVar19 = fVar8 * fVar6 + fVar8 * fVar9 + fVar4 * fVar36 + fVar33 * fVar8;
  fVar20 = fVar8 * fVar12 + fVar4 * fVar28 + fVar8 * fVar24 + fVar8;
  fVar7 = tOffset->z;
  fVar17 = fVar8 * fVar7 + fVar8 * fVar10 + fVar4 * fVar25 + fVar8 * fVar35;
  fVar4 = sOffset->y;
  fVar8 = fVar4 * 0.0;
  fVar26 = fVar8 * fVar5 + fVar8 * fVar32 + fVar8 * fVar30 + fVar29 * fVar4;
  fVar27 = fVar8 * fVar6 + fVar8 * fVar9 + fVar8 * fVar36 + fVar33 * fVar4;
  fVar13 = fVar8 * fVar12 + fVar8 * fVar28 + fVar4 * fVar24 + fVar8;
  fVar11 = fVar8 * fVar7 + fVar8 * fVar10 + fVar8 * fVar25 + fVar35 * fVar4;
  fVar4 = sOffset->z;
  fVar8 = fVar4 * 0.0;
  fVar21 = fVar8 * fVar5 + fVar4 * fVar32 + fVar8 * fVar30 + fVar29 * fVar8;
  fVar22 = fVar8 * fVar6 + fVar4 * fVar9 + fVar8 * fVar36 + fVar33 * fVar8;
  fVar31 = fVar4 * fVar12 + fVar8 * fVar28 + fVar24 * fVar8 + fVar8;
  fVar23 = fVar8 * fVar7 + fVar4 * fVar10 + fVar8 * fVar25 + fVar35 * fVar8;
  fVar5 = fVar32 * 0.0 + fVar30 * 0.0 + fVar29 * 0.0 + fVar5;
  fVar6 = fVar9 * 0.0 + fVar36 * 0.0 + fVar33 * 0.0 + fVar6;
  fVar7 = fVar10 * 0.0 + fVar25 * 0.0 + fVar35 * 0.0 + fVar7;
  fVar4 = inMat->x[1][0];
  fVar9 = inMat->x[0][0];
  fVar8 = inMat->x[2][0];
  fVar10 = inMat->x[3][0];
  fVar14 = fVar20 * fVar10 + fVar17 * fVar8 + fVar18 * fVar9 + fVar4 * fVar19;
  fVar16 = inMat->x[1][1];
  fVar25 = inMat->x[0][1];
  fVar29 = inMat->x[2][1];
  fVar32 = inMat->x[3][1];
  fVar15 = fVar20 * fVar32 + fVar17 * fVar29 + fVar18 * fVar25 + fVar19 * fVar16;
  fVar30 = inMat->x[1][2];
  fVar33 = inMat->x[0][2];
  fVar35 = inMat->x[2][2];
  fVar36 = inMat->x[3][2];
  fVar34 = fVar20 * fVar36 + fVar17 * fVar35 + fVar18 * fVar33 + fVar19 * fVar30;
  fVar1 = inMat->x[1][3];
  fVar37 = inMat->x[0][3];
  fVar2 = inMat->x[2][3];
  fVar3 = inMat->x[3][3];
  fVar17 = fVar20 * fVar3 + fVar17 * fVar2 + fVar18 * fVar37 + fVar19 * fVar1;
  fVar18 = fVar13 * fVar10 + fVar11 * fVar8 + fVar26 * fVar9 + fVar4 * fVar27;
  fVar19 = fVar13 * fVar32 + fVar11 * fVar29 + fVar26 * fVar25 + fVar27 * fVar16;
  fVar20 = fVar13 * fVar36 + fVar11 * fVar35 + fVar26 * fVar33 + fVar27 * fVar30;
  fVar11 = fVar13 * fVar3 + fVar11 * fVar2 + fVar26 * fVar37 + fVar27 * fVar1;
  fVar27 = fVar31 * fVar10 + fVar23 * fVar8 + fVar21 * fVar9 + fVar4 * fVar22;
  fVar13 = fVar31 * fVar32 + fVar23 * fVar29 + fVar21 * fVar25 + fVar22 * fVar16;
  fVar26 = fVar31 * fVar36 + fVar23 * fVar35 + fVar21 * fVar33 + fVar22 * fVar30;
  fVar23 = fVar31 * fVar3 + fVar23 * fVar2 + fVar21 * fVar37 + fVar22 * fVar1;
  fVar24 = fVar12 * 0.0 + fVar28 * 0.0 + fVar24 * 0.0 + 1.0;
  fVar12 = fVar10 * fVar24 + fVar8 * fVar7 + fVar9 * fVar5 + fVar4 * fVar6;
  fVar22 = fVar32 * fVar24 + fVar29 * fVar7 + fVar25 * fVar5 + fVar16 * fVar6;
  fVar21 = fVar36 * fVar24 + fVar35 * fVar7 + fVar33 * fVar5 + fVar30 * fVar6;
  fVar37 = fVar24 * fVar3 + fVar7 * fVar2 + fVar5 * fVar37 + fVar6 * fVar1;
  fVar4 = ref->x[1][0];
  fVar5 = ref->x[1][1];
  fVar6 = ref->x[1][2];
  fVar7 = ref->x[1][3];
  fVar9 = ref->x[0][0];
  fVar8 = ref->x[0][1];
  fVar10 = ref->x[0][2];
  fVar16 = ref->x[0][3];
  fVar25 = ref->x[2][0];
  fVar29 = ref->x[2][1];
  fVar32 = ref->x[2][2];
  fVar30 = ref->x[2][3];
  fVar33 = ref->x[3][0];
  fVar35 = ref->x[3][1];
  fVar36 = ref->x[3][2];
  fVar1 = ref->x[3][3];
  __return_storage_ptr__->x[0][0] =
       fVar17 * fVar33 + fVar34 * fVar25 + fVar14 * fVar9 + fVar15 * fVar4;
  __return_storage_ptr__->x[0][1] =
       fVar17 * fVar35 + fVar34 * fVar29 + fVar14 * fVar8 + fVar15 * fVar5;
  __return_storage_ptr__->x[0][2] =
       fVar17 * fVar36 + fVar34 * fVar32 + fVar14 * fVar10 + fVar15 * fVar6;
  __return_storage_ptr__->x[0][3] =
       fVar17 * fVar1 + fVar34 * fVar30 + fVar14 * fVar16 + fVar15 * fVar7;
  __return_storage_ptr__->x[1][0] =
       fVar11 * fVar33 + fVar20 * fVar25 + fVar18 * fVar9 + fVar19 * fVar4;
  __return_storage_ptr__->x[1][1] =
       fVar11 * fVar35 + fVar20 * fVar29 + fVar18 * fVar8 + fVar19 * fVar5;
  __return_storage_ptr__->x[1][2] =
       fVar11 * fVar36 + fVar20 * fVar32 + fVar18 * fVar10 + fVar19 * fVar6;
  __return_storage_ptr__->x[1][3] =
       fVar11 * fVar1 + fVar20 * fVar30 + fVar18 * fVar16 + fVar19 * fVar7;
  __return_storage_ptr__->x[2][0] =
       fVar23 * fVar33 + fVar26 * fVar25 + fVar27 * fVar9 + fVar13 * fVar4;
  __return_storage_ptr__->x[2][1] =
       fVar23 * fVar35 + fVar26 * fVar29 + fVar27 * fVar8 + fVar13 * fVar5;
  __return_storage_ptr__->x[2][2] =
       fVar23 * fVar36 + fVar26 * fVar32 + fVar27 * fVar10 + fVar13 * fVar6;
  __return_storage_ptr__->x[2][3] =
       fVar23 * fVar1 + fVar26 * fVar30 + fVar27 * fVar16 + fVar13 * fVar7;
  __return_storage_ptr__->x[3][0] =
       fVar37 * fVar33 + fVar21 * fVar25 + fVar12 * fVar9 + fVar22 * fVar4;
  __return_storage_ptr__->x[3][1] =
       fVar37 * fVar35 + fVar21 * fVar29 + fVar12 * fVar8 + fVar22 * fVar5;
  __return_storage_ptr__->x[3][2] =
       fVar37 * fVar36 + fVar21 * fVar32 + fVar12 * fVar10 + fVar22 * fVar6;
  __return_storage_ptr__->x[3][3] =
       fVar37 * fVar1 + fVar21 * fVar30 + fVar12 * fVar16 + fVar22 * fVar7;
  return __return_storage_ptr__;
}

Assistant:

Matrix44<T>
addOffset (
    const Matrix44<T>& inMat,
    const Vec3<T>&     tOffset,
    const Vec3<T>&     rOffset,
    const Vec3<T>&     sOffset,
    const Matrix44<T>& ref)
{
    Matrix44<T> O;

    Vec3<T> _rOffset (rOffset);
    _rOffset *= T(M_PI / 180.0);
    O.rotate (_rOffset);

    O[3][0] = tOffset[0];
    O[3][1] = tOffset[1];
    O[3][2] = tOffset[2];

    Matrix44<T> S;
    S.scale (sOffset);

    Matrix44<T> X = S * O * inMat * ref;

    return X;
}